

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

string * __thiscall
kratos::StringConst::to_string_abi_cxx11_(string *__return_storage_ptr__,StringConst *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_28;
  size_type sStack_20;
  
  local_28 = (this->value_)._M_dataplus._M_p;
  sStack_20 = (this->value_)._M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x5;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_28;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)"\"{0}\"",format_str,args);
  return __return_storage_ptr__;
}

Assistant:

std::string StringConst::to_string() const { return ::format("\"{0}\"", value_); }